

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFATests.cpp
# Opt level: O1

void __thiscall TestAnalysis::TestAnalysis(TestAnalysis *this,Symbol *symbol)

{
  size_t sVar1;
  
  slang::analysis::FlowAnalysisBase::FlowAnalysisBase
            ((FlowAnalysisBase *)this,symbol,(AnalysisOptions)(ZEXT412(0xffff) << 0x40),
             (Diagnostics *)0x0);
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).isStateSplit = false;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).inCondition = false;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).breakStates.super_SmallVectorBase<int>.data_
       = (pointer)(this->super_AbstractFlowAnalysis<TestAnalysis,_int>).breakStates.
                  super_SmallVectorBase<int>.firstElement;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).breakStates.super_SmallVectorBase<int>.len =
       0;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).breakStates.super_SmallVectorBase<int>.cap =
       10;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).returnStates.super_SmallVectorBase<int>.
  data_ = (pointer)(this->super_AbstractFlowAnalysis<TestAnalysis,_int>).returnStates.
                   super_SmallVectorBase<int>.firstElement;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).returnStates.super_SmallVectorBase<int>.len
       = 0;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).returnStates.super_SmallVectorBase<int>.cap
       = 10;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  sVar1 = 0x1d;
  if ((this->super_AbstractFlowAnalysis<TestAnalysis,_int>).disableBranches.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar1 = 0;
  }
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
  .size_ctrl.ml = sVar1;
  (this->super_AbstractFlowAnalysis<TestAnalysis,_int>).disableBranches.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
  .size_ctrl.size = 0;
  return;
}

Assistant:

TestAnalysis(const Symbol& symbol) : AbstractFlowAnalysis(symbol, {}) {}